

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O0

bool __thiscall LEFReader::parseClass(LEFReader *this)

{
  token_t tVar1;
  allocator<char> local_99;
  string local_98;
  undefined4 local_78;
  allocator<char> local_71;
  string local_70;
  byte local_39;
  string local_38 [7];
  bool foundOne;
  string className;
  LEFReader *this_local;
  
  className.field_2._8_8_ = this;
  std::__cxx11::string::string(local_38);
  local_39 = 0;
  tVar1 = tokenize(this,&this->m_tokstr);
  this->m_curtok = tVar1;
  while (this->m_curtok == TOK_IDENT) {
    local_39 = 1;
    std::__cxx11::string::operator+=(local_38,(string *)&this->m_tokstr);
    std::__cxx11::string::operator+=(local_38," ");
    tVar1 = tokenize(this,&this->m_tokstr);
    this->m_curtok = tVar1;
  }
  if ((local_39 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Expected at least one class\n",&local_71);
    error(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    this_local._7_1_ = false;
  }
  else if (this->m_curtok == TOK_SEMICOL) {
    (*this->_vptr_LEFReader[3])(this,local_38);
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Expected a semicolon\n",&local_99);
    error(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    this_local._7_1_ = false;
  }
  local_78 = 1;
  std::__cxx11::string::~string(local_38);
  return this_local._7_1_;
}

Assistant:

bool LEFReader::parseClass()
{
    // CLASS name <optional name> ';'

    std::string className;
    

    // read in all the classes
    bool foundOne = false;
    m_curtok = tokenize(m_tokstr);
    while(m_curtok == TOK_IDENT)
    {
        foundOne = true;
        className += m_tokstr;
        className += " ";
        m_curtok = tokenize(m_tokstr);
    }
    if (!foundOne)
    {
        error("Expected at least one class\n");
        return false;
    }
    
    if (m_curtok != TOK_SEMICOL)
    {
        error("Expected a semicolon\n");
        return false;
    }

    onClass(className);

    return true;
}